

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFunctionDecPOMDPDiscrete.cpp
# Opt level: O1

double __thiscall
ValueFunctionDecPOMDPDiscrete::CalculateVsjohRecursively<true>
          (ValueFunctionDecPOMDPDiscrete *this,Index sI,Index johI,Index stage)

{
  undefined1 auVar1 [16];
  DecPOMDPDiscreteInterface *pDVar2;
  MultiAgentDecisionProcessDiscreteInterface *pMVar3;
  int iVar4;
  Index johI_00;
  iterator iVar5;
  value_type *pvVar6;
  Index sI_00;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  double dVar13;
  undefined1 auVar14 [16];
  ulong local_58;
  key_type local_4c;
  double local_48;
  double local_40;
  key_type local_34;
  undefined1 extraout_var [56];
  
  iVar4 = (*(this->_m_jpol->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy[0x11])
                    (this->_m_jpol,(ulong)johI);
  pDVar2 = this->_m_pu->_m_DecPOMDP;
  dVar9 = (double)(**(code **)(*(long *)pDVar2 + 0xc0))(pDVar2,sI,iVar4);
  if ((ulong)stage < this->_m_h - 1) {
    if (this->_m_nrS == 0) {
      dVar13 = 0.0;
    }
    else {
      uVar7 = 0;
      auVar10 = ZEXT816(0);
      do {
        local_58 = auVar10._0_8_;
        pMVar3 = (this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp;
        sI_00 = (Index)uVar7;
        local_48 = (double)(**(code **)((long)*pMVar3 + 0x108))(pMVar3,sI,iVar4,uVar7);
        if (this->_m_nrJO == 0) {
          auVar10._8_8_ = 0;
          auVar10._0_8_ = local_58;
        }
        else {
          uVar8 = 0;
          do {
            pMVar3 = (this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp;
            local_40 = (double)(**(code **)((long)*pMVar3 + 0x118))(pMVar3,iVar4,uVar7,uVar8);
            johI_00 = PlanningUnitMADPDiscrete::GetSuccessorJOHI
                                (&this->_m_pu->super_PlanningUnitMADPDiscrete,johI,(Index)uVar8);
            local_4c = (int)this->_m_nrJOH * sI_00 + johI_00;
            iVar5 = boost::unordered::detail::
                    table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
                    ::find_node((table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
                                 *)&this->_m_cache,&local_4c);
            if (iVar5.node_ == (node_pointer)0x0) {
              auVar12._0_8_ = CalculateVsjohRecursively<true>(this,sI_00,johI_00,stage + 1);
              auVar12._8_56_ = extraout_var;
              auVar11 = auVar12._0_16_;
            }
            else {
              auVar11._8_8_ = 0;
              auVar11._0_8_ =
                   *(ulong *)((long)&((iVar5.node_)->
                                     super_value_base<std::pair<const_unsigned_int,_double>_>).data_
                                     .data_ + 8);
            }
            auVar1._8_8_ = 0;
            auVar1._0_8_ = local_58;
            auVar14._8_8_ = 0;
            auVar14._0_8_ = local_40 * local_48;
            auVar10 = vfmadd213sd_fma(auVar14,auVar11,auVar1);
            uVar8 = (ulong)((Index)uVar8 + 1);
            local_58 = auVar10._0_8_;
          } while (uVar8 < this->_m_nrJO);
        }
        dVar13 = auVar10._0_8_;
        uVar7 = (ulong)(sI_00 + 1);
      } while (uVar7 < this->_m_nrS);
    }
    dVar9 = dVar9 + dVar13;
    local_34 = sI * (int)this->_m_nrJOH + johI;
    pvVar6 = boost::unordered::detail::
             table_impl<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
             ::operator[](&(this->_m_cache).table_,&local_34);
    pvVar6->second = dVar9;
  }
  return dVar9;
}

Assistant:

double ValueFunctionDecPOMDPDiscrete::CalculateVsjohRecursively(Index sI,Index johI, Index stage)
{
#if DEBUG_CALCV
    std::cout<< "\nValueFunctionDecPOMDPDiscrete::CalculateVsjohRecursively("
             << sI << ", " << johI << ") called"<<std::endl;
#endif

    Index jaI = GetJPol()->GetJointActionIndex(johI);
    double R = _m_pu->GetReward(sI, jaI);
    double ExpFutureR = 0.0;
    // horizon h policy makes decision on observation histories which 
    // maximally have length h-1. 
    // t=0 - () - length=0 
    // ... 
    // t=h-1 - (o1,...,o{h-1}) - length h-1
    if( ( CACHED && stage >= _m_h - 1) ||
        (!CACHED && _m_pu->GetTimeStepForJOHI(johI) >= _m_h - 1 ) )
    {
#if DEBUG_CALCV
        std::cout << "ValueFunctionDecPOMDPDiscrete::CalculateVsjoh"
                  << "Recursively("<< sI <<", " << johI << ") - V="<<R<<std::endl;
#endif
        return(R);
    }

#if DEBUG_CALCV
    std::cout << "Calculating future reward"<<std::endl;
#endif
    for(Index sucSI = 0; sucSI < _m_nrS; sucSI++)
    {
        double probSucSI = _m_pu->GetTransitionProbability(sI, jaI,sucSI);
#if DEBUG_CALCV
        std::cout << "P(s"<<sucSI<<"|s"<<sI<<",ja"<<jaI<<")="<<probSucSI<<std::endl;
#endif

        for(Index joI = 0; joI < _m_nrJO; joI++)
        {
            double probJOI =  _m_pu->GetObservationProbability(jaI, sucSI, joI);
#if DEBUG_CALCV
            std::cout << "P(jo"<<joI<<"|ja"<<jaI<<",s"<<sucSI<<")="<<probJOI<<std::endl;
#endif
            Index sucJohI = _m_pu->GetSuccessorJOHI(johI, joI);

            double thisSucV;
            bool valid=false;
            if (CACHED)
                thisSucV=GetCached(sucSI,sucJohI,valid); // read from cache
            if (!valid) // if not found in cache or cache is not used
                thisSucV=CalculateVsjohRecursively<CACHED>(sucSI,sucJohI,stage+1);
            ExpFutureR += probSucSI * probJOI * thisSucV;
        }//end for each observation
    }//end for each potential succesor state
    double val = R + ExpFutureR;
    if (CACHED)
        SetCached(sI, johI, val); // write to cache
#if DEBUG_CALCV
    std::cout << "ValueFunctionDecPOMDPDiscrete::CalculateVsjohRecursively("
              << sI <<", " << johI << ") \n->immediate R="<<R
              << " \n->exp. future reward="<<ExpFutureR<<"\n->V="<<val<<std::endl;
#endif
    return(val);
}